

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

bool doctest::detail::parseFlagImpl(int argc,char **argv,char *pattern)

{
  char *pcVar1;
  char *__haystack;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  
  bVar6 = 0 < argc;
  if (0 < argc) {
    uVar8 = (ulong)(uint)argc;
    do {
      __haystack = argv[uVar8 - 1];
      pcVar3 = strstr(__haystack,pattern);
      if (pcVar3 != (char *)0x0) {
        pcVar4 = (char *)0x0;
        do {
          pcVar5 = pcVar3 + (long)pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (*pcVar5 != '\0');
        pcVar5 = pattern;
        pcVar7 = pattern + -1;
        if (pattern != (char *)0x0) {
          do {
            pcVar5 = pcVar7 + 1;
            pcVar1 = pcVar7 + 1;
            pcVar7 = pcVar5;
          } while (*pcVar1 != '\0');
        }
        if (pcVar5 + (1 - (long)pattern) == pcVar4) {
          do {
            if (pcVar3 == __haystack) {
              if (*__haystack == '-') {
                return bVar6;
              }
              break;
            }
            pcVar4 = pcVar3 + -1;
            pcVar3 = pcVar3 + -1;
          } while (*pcVar4 == '-');
        }
      }
      bVar6 = 1 < (long)uVar8;
      bVar2 = 1 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar2);
  }
  return bVar6;
}

Assistant:

bool parseFlagImpl(int argc, const char* const* argv, const char* pattern) {
        for(int i = argc - 1; i >= 0; --i) {
            const char* temp = strstr(argv[i], pattern);
            if(temp && my_strlen(temp) == my_strlen(pattern)) {
                // eliminate strings in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                while(temp != argv[i]) {
                    if(*--temp != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[i][0] == '-')
                    return true;
            }
        }
        return false;
    }